

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdD3D6CombineControl::is_valid_val(MthdD3D6CombineControl *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((((((uVar1 & 0xe0e0e0) == 0) && (uVar2 = uVar1 >> 2 & 7, uVar2 != 0)) &&
       (uVar3 = uVar1 >> 10 & 7, uVar3 != 0)) &&
      ((uVar4 = uVar1 >> 0x12 & 7, uVar4 != 0 &&
       (uVar5 = uVar1 >> 0x1a & 7, 0x1fffffff < uVar1 && uVar5 != 0)))) &&
     ((this->which == 0 || (((uVar5 != 7 && (uVar4 != 7)) && ((uVar2 != 7 && (uVar3 != 7)))))))) {
    return true;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (val & 0x00e0e0e0)
			return false;
		if (!extr(val, 2, 3))
			return false;
		if (!extr(val, 10, 3))
			return false;
		if (!extr(val, 18, 3))
			return false;
		if (!extr(val, 26, 3))
			return false;
		if (!extr(val, 29, 3))
			return false;
		if (which) {
			if (extr(val, 2, 3) == 7)
				return false;
			if (extr(val, 10, 3) == 7)
				return false;
			if (extr(val, 18, 3) == 7)
				return false;
			if (extr(val, 26, 3) == 7)
				return false;
		}
		return true;
	}